

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O2

void __thiscall
cmCTestBuildAndTestCaptureRAII::~cmCTestBuildAndTestCaptureRAII
          (cmCTestBuildAndTestCaptureRAII *this)

{
  _Any_data local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  _Any_data local_28;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  cmake::SetProgressCallback(this->CM,(ProgressCallbackType *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  cmSystemTools::SetStderrCallback((OutputCallback *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  local_58 = 0;
  uStack_50 = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  cmSystemTools::SetStdoutCallback((OutputCallback *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  local_78 = 0;
  uStack_70 = 0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  cmSystemTools::SetMessageCallback((MessageCallback *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  return;
}

Assistant:

~cmCTestBuildAndTestCaptureRAII()
  {
    this->CM.SetProgressCallback(nullptr);
    cmSystemTools::SetStderrCallback(nullptr);
    cmSystemTools::SetStdoutCallback(nullptr);
    cmSystemTools::SetMessageCallback(nullptr);
  }